

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

Bool InlineElementToCSS(TidyDocImpl *doc,Node *node,Node **pnode)

{
  Bool BVar1;
  ctmbstr local_30;
  ctmbstr CSSeq;
  Node **pnode_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  CSSeq = (ctmbstr)pnode;
  pnode_local = &node->parent;
  node_local = &doc->root;
  if ((node->parent->content == node) && (node->next == (Node *)0x0)) {
    BVar1 = CanApplyBlockStyle(node->parent);
    if (BVar1 == no) {
      BVar1 = CanApplyInlineStyle(*pnode_local);
      if (BVar1 == no) goto LAB_001660ab;
    }
    doc_local._4_4_ = no;
  }
  else {
LAB_001660ab:
    BVar1 = FindCSSSpanEq((Node *)pnode_local,&local_30,yes);
    if (BVar1 == no) {
      doc_local._4_4_ = no;
    }
    else {
      RenameElem((TidyDocImpl *)node_local,(Node *)pnode_local,TidyTag_SPAN);
      prvTidyAddStyleProperty((TidyDocImpl *)node_local,(Node *)pnode_local,local_30);
      doc_local._4_4_ = yes;
    }
  }
  return doc_local._4_4_;
}

Assistant:

static Bool InlineElementToCSS( TidyDocImpl* doc, Node* node,
                                Node **ARG_UNUSED(pnode)  )
{
    ctmbstr CSSeq;

    /* if node is the only child of parent element then leave alone
          Do so only if BlockStyle may be succesful. */
    if ( node->parent->content == node && node->next == NULL &&
         (CanApplyBlockStyle(node->parent)
          || CanApplyInlineStyle(node->parent)) )
        return no;

    if ( FindCSSSpanEq(node, &CSSeq, yes) )
    {
        RenameElem( doc, node, TidyTag_SPAN );
        TY_(AddStyleProperty)( doc, node, CSSeq );
        return yes;
    }
    return no;
}